

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

int cs_op_index(csh ud,cs_insn *insn,uint op_type,uint post)

{
  uint i;
  uint count;
  cs_struct *handle;
  uint post_local;
  uint op_type_local;
  cs_insn *insn_local;
  csh ud_local;
  
  count = 0;
  if (ud != 0) {
    if (*(int *)(ud + 0x60) == 0) {
      *(undefined4 *)(ud + 0x50) = 7;
    }
    else if (insn->id == 0) {
      *(undefined4 *)(ud + 0x50) = 0xb;
    }
    else if (insn->detail == (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x50) = 7;
    }
    else {
      *(undefined4 *)(ud + 0x50) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        for (i = 0; i < (insn->detail->field_6).arm.op_count; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x30 + 0x41) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 1:
        for (i = 0; i < (insn->detail->field_6).x86.opcode[2]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x38 + 0x2d) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 2:
        for (i = 0; i < (insn->detail->field_6).x86.prefix[0]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x18 + 0x15) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 3:
        for (i = 0; i < (insn->detail->field_6).x86.op_count; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x30 + 0x55) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 4:
        for (i = 0; i < (insn->detail->field_6).x86.addr_size; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x18 + 0x1d) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 5:
        for (i = 0; i < (insn->detail->field_6).x86.rex; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x10 + 0x1d) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 6:
        for (i = 0; i < (insn->detail->field_6).x86.opcode[0]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x20 + 0x15) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 7:
        for (i = 0; i < (insn->detail->field_6).x86.prefix[0]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x10 + 0x11) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 8:
        for (i = 0; i < (insn->detail->field_6).m68k.op_count; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x38 + 0x3d) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 9:
        for (i = 0; i < (insn->detail->field_6).x86.prefix[0]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x20 + 0x11) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 10:
        for (i = 0; i < (insn->detail->field_6).x86.prefix[1]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 0x18 + 0x11) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      case 0xb:
        break;
      case 0xc:
        for (i = 0; i < (insn->detail->field_6).x86.opcode[1]; i = i + 1) {
          if (*(uint *)(insn->detail->groups + (ulong)i * 8 + 0x15) == op_type) {
            count = count + 1;
          }
          if (count == post) {
            return i;
          }
        }
        break;
      default:
        *(undefined4 *)(ud + 0x50) = 3;
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

CAPSTONE_API cs_op_index(csh ud, const cs_insn *insn, unsigned int op_type,
		unsigned int post)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++) {
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++) {
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++) {
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++) {
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++) {
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++) {
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++) {
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++) {
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_M68K:
			for (i = 0; i < insn->detail->m68k.op_count; i++) {
				if (insn->detail->m68k.operands[i].type == (m68k_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_TMS320C64X:
			for (i = 0; i < insn->detail->tms320c64x.op_count; i++) {
				if (insn->detail->tms320c64x.operands[i].type == (tms320c64x_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_M680X:
			for (i = 0; i < insn->detail->m680x.op_count; i++) {
				if (insn->detail->m680x.operands[i].type == (m680x_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_EVM:
#if 0
			for (i = 0; i < insn->detail->evm.op_count; i++) {
				if (insn->detail->evm.operands[i].type == (evm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
#endif
			break;
		case CS_ARCH_MOS65XX:
			for (i = 0; i < insn->detail->mos65xx.op_count; i++) {
				if (insn->detail->mos65xx.operands[i].type == (mos65xx_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
	}

	return -1;
}